

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzer.cpp
# Opt level: O1

uint64_t __thiscall
SimpleParallelAnalyzer::AddFrame
          (SimpleParallelAnalyzer *this,uint16_t value,uint64_t starting_sample,
          uint64_t ending_sample)

{
  long lVar1;
  FrameV2 frame_v2;
  Frame frame;
  FrameV2 local_60 [8];
  ulonglong local_58;
  uint64_t local_50;
  ulong local_48;
  undefined1 local_37;
  
  if (starting_sample <= ending_sample) {
    FrameV2::FrameV2(local_60);
    FrameV2::AddInteger((char *)local_60,0x109030);
    Frame::Frame((Frame *)&local_58);
    local_37 = 0;
    local_58 = starting_sample;
    local_50 = ending_sample;
    local_48 = (ulong)value;
    AnalyzerResults::AddFrame
              ((Frame *)(this->mResults)._M_t.
                        super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
                        .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>._M_head_impl)
    ;
    AnalyzerResults::AddFrameV2
              ((FrameV2 *)
               (this->mResults)._M_t.
               super___uniq_ptr_impl<SimpleParallelAnalyzerResults,_std::default_delete<SimpleParallelAnalyzerResults>_>
               ._M_t.
               super__Tuple_impl<0UL,_SimpleParallelAnalyzerResults_*,_std::default_delete<SimpleParallelAnalyzerResults>_>
               .super__Head_base<0UL,_SimpleParallelAnalyzerResults_*,_false>._M_head_impl,
               (char *)local_60,0x109030,local_58);
    AnalyzerResults::CommitResults();
    lVar1 = 1;
    if (ending_sample - starting_sample != 0) {
      lVar1 = ending_sample - starting_sample;
    }
    this->mLastFrameWidth = lVar1;
    Frame::~Frame((Frame *)&local_58);
    FrameV2::~FrameV2(local_60);
    return ending_sample;
  }
  __assert_fail("starting_sample <= ending_sample",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/saleae[P]simple-parallel-analyzer/src/SimpleParallelAnalyzer.cpp"
                ,0x12f,"uint64_t SimpleParallelAnalyzer::AddFrame(uint16_t, uint64_t, uint64_t)");
}

Assistant:

uint64_t SimpleParallelAnalyzer::AddFrame( uint16_t value, uint64_t starting_sample, uint64_t ending_sample )
{
    assert( starting_sample <= ending_sample );
    FrameV2 frame_v2;
    frame_v2.AddInteger( "data", value );

    Frame frame;
    frame.mData1 = value;
    frame.mFlags = 0;
    frame.mStartingSampleInclusive = starting_sample;
    frame.mEndingSampleInclusive = ending_sample;
    mResults->AddFrame( frame );
    mResults->AddFrameV2( frame_v2, "data", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
    mResults->CommitResults();
    mLastFrameWidth = std::max<uint64_t>( ending_sample - starting_sample, 1 );
    return ending_sample;
}